

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_classes.h
# Opt level: O2

filtered_directed_graph_t *
read_filtered_directed_graph
          (filtered_directed_graph_t *__return_storage_ptr__,string *input_filename,
          flagser_parameters *params)

{
  string *__lhs;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  invalid_argument *this;
  filtered_directed_graph_t *__return_storage_ptr___00;
  string in_stack_ffffffffffffff58;
  string err_msg;
  string local_60;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  std::operator<<(poVar2,"reading in the graph");
  poVar2 = (ostream *)std::ostream::flush();
  std::operator<<(poVar2,"\r");
  __lhs = &params->input_format;
  bVar1 = std::operator==(__lhs,"h5");
  if ((!bVar1) && ((params->hdf5_type)._M_string_length == 0)) {
    lVar3 = std::__cxx11::string::rfind((char *)input_filename,0x14c40b);
    if (lVar3 == -1) {
      bVar1 = std::operator==(__lhs,"flagser");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_60,(string *)input_filename);
        read_graph_flagser(__return_storage_ptr__,&local_60,params);
        std::__cxx11::string::~string((string *)&local_60);
        return __return_storage_ptr__;
      }
      goto LAB_00131e94;
    }
  }
  __return_storage_ptr___00 = (filtered_directed_graph_t *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string((string *)__return_storage_ptr___00,(string *)input_filename);
  read_graph_h5(__return_storage_ptr___00,in_stack_ffffffffffffff58,
                (flagser_parameters *)input_filename);
LAB_00131e94:
  std::operator<<((ostream *)&std::cout,"\x1b[K");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff60,"The input format \"",__lhs);
  std::operator+(&err_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffff60,"\" could not be found.");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,(string *)&err_msg);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

filtered_directed_graph_t read_filtered_directed_graph(std::string input_filename, const flagser_parameters& params) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "reading in the graph" << std::flush << "\r";
#endif

	if (params.input_format == "h5" || params.hdf5_type.size() > 0 ||
	    (input_filename.rfind(".h5") != std::string::npos)) {
		return read_graph_h5(input_filename, params);
	}
	if (params.input_format == "flagser") return read_graph_flagser(input_filename, params);

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K";
#endif

	std::string err_msg = "The input format \"" + params.input_format + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}